

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenstream.cpp
# Opt level: O2

bool __thiscall embree::TokenStream::trySymbol(TokenStream *this,string *symbol)

{
  char cVar1;
  ulong uVar2;
  Stream<int> *this_00;
  int *piVar3;
  size_t pos;
  ulong n;
  
  n = 0;
  do {
    uVar2 = symbol->_M_string_length;
    if (uVar2 <= n) {
LAB_001bc627:
      return uVar2 <= n;
    }
    cVar1 = (symbol->_M_dataplus)._M_p[n];
    piVar3 = Stream<int>::peek((this->cin).ptr);
    this_00 = (this->cin).ptr;
    if (*piVar3 != (int)cVar1) {
      Stream<int>::unget(this_00,n);
      goto LAB_001bc627;
    }
    Stream<int>::drop(this_00);
    n = n + 1;
  } while( true );
}

Assistant:

bool TokenStream::trySymbol(const std::string& symbol)
  {
    size_t pos = 0;
    while (pos < symbol.size()) {
      if (symbol[pos] != cin->peek()) { cin->unget(pos); return false; }
      cin->drop(); pos++;
    }
    return true;
  }